

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O2

bool __thiscall VersionsList::VersionLess(VersionsList *this,string *a,string *b)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = version_compare4((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,this->flags_);
  if (iVar2 < 0) {
    bVar1 = true;
  }
  else {
    if (iVar2 == 0) {
      bVar1 = std::operator<(a,b);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VersionLess(const std::string& a, const std::string& b) const {
		int res = version_compare4(a.c_str(), b.c_str(), flags_, flags_);
		if (res < 0) {
			return true;
		}
		if (res > 0) {
			return false;
		}

		return a < b;  // fallback to stringwise comparison for stable ordering
	}